

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v8::detail::format_uint<1u,char,unsigned_long>
                 (char *buffer,unsigned_long value,int num_digits,bool upper)

{
  uint digit;
  char *digits;
  char *end;
  bool upper_local;
  unsigned_long uStack_18;
  int num_digits_local;
  unsigned_long value_local;
  char *buffer_local;
  
  uStack_18 = value;
  value_local = (unsigned_long)(buffer + num_digits);
  do {
    *(byte *)(value_local - 1) = ((byte)uStack_18 & 1) + 0x30;
    uStack_18 = uStack_18 >> 1;
    value_local = value_local - 1;
  } while (uStack_18 != 0);
  return buffer + num_digits;
}

Assistant:

FMT_CONSTEXPR auto format_uint(Char* buffer, UInt value, int num_digits,
                               bool upper = false) -> Char* {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}